

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GenImageCellular(Image *__return_storage_ptr__,int width,int height,int tileSize)

{
  ulong uVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *__ptr;
  long lVar7;
  long lVar8;
  int j;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  ulong local_88;
  
  pvVar6 = malloc((long)(height * width) << 2);
  iVar14 = width / tileSize;
  uVar9 = (height / tileSize) * iVar14;
  __ptr = malloc((long)(int)uVar9 * 8);
  if (0 < (int)uVar9) {
    uVar12 = 0;
    do {
      uVar1 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
      iVar3 = GetRandomValue(0,tileSize + -1);
      iVar4 = GetRandomValue(0,tileSize + -1);
      *(float *)((long)__ptr + uVar12 * 8) =
           (float)(iVar4 + (int)((long)uVar1 % (long)iVar14) * tileSize);
      *(float *)((long)__ptr + uVar12 * 8 + 4) =
           (float)(iVar3 + (int)((long)uVar1 / (long)iVar14) * tileSize);
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  if (0 < height) {
    local_88 = 0;
    do {
      if (0 < width) {
        lVar8 = local_88 * (uint)width;
        iVar3 = (int)((long)((ulong)(uint)((int)local_88 >> 0x1f) << 0x20 | local_88 & 0xffffffff) /
                     (long)tileSize);
        uVar12 = 0;
        do {
          dVar17 = strtod("Inf",(char **)0x0);
          fVar18 = (float)dVar17;
          iVar4 = (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
                       (long)tileSize);
          iVar11 = (iVar3 + -1) * iVar14 + -1 + iVar4;
          iVar13 = -1;
          do {
            iVar5 = iVar13 + iVar4;
            if (iVar5 < iVar14 && -1 < iVar5) {
              lVar10 = -1;
              iVar5 = iVar11;
              do {
                lVar7 = iVar3 + lVar10;
                if (lVar7 < height / tileSize && -1 < lVar7) {
                  dVar17 = hypot((double)((int)uVar12 -
                                         (int)*(float *)((long)__ptr + (long)iVar5 * 8)),
                                 (double)((int)local_88 -
                                         (int)*(float *)((long)__ptr + (long)iVar5 * 8 + 4)));
                  fVar15 = (float)dVar17;
                  fVar16 = fVar15;
                  if (fVar18 <= fVar15) {
                    fVar16 = fVar18;
                  }
                  fVar18 = (float)(~-(uint)NAN(fVar18) & (uint)fVar16 |
                                  -(uint)NAN(fVar18) & (uint)fVar15);
                }
                lVar10 = lVar10 + 1;
                iVar5 = iVar5 + iVar14;
              } while (lVar10 != 2);
            }
            iVar13 = iVar13 + 1;
            iVar11 = iVar11 + 1;
          } while (iVar13 != 2);
          iVar4 = (int)((fVar18 * 256.0) / (float)tileSize);
          uVar2 = (undefined1)iVar4;
          if (0xfe < iVar4) {
            uVar2 = 0xff;
          }
          *(undefined1 *)((long)pvVar6 + uVar12 * 4 + lVar8 * 4) = uVar2;
          *(undefined1 *)((long)pvVar6 + uVar12 * 4 + lVar8 * 4 + 1) = uVar2;
          *(undefined1 *)((long)pvVar6 + uVar12 * 4 + lVar8 * 4 + 2) = uVar2;
          *(undefined1 *)((long)pvVar6 + uVar12 * 4 + lVar8 * 4 + 3) = 0xff;
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uint)width);
      }
      local_88 = local_88 + 1;
    } while (local_88 != (uint)height);
  }
  free(__ptr);
  __return_storage_ptr__->data = pvVar6;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageCellular(int width, int height, int tileSize)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    int seedsPerRow = width/tileSize;
    int seedsPerCol = height/tileSize;
    int seedsCount = seedsPerRow*seedsPerCol;

    Vector2 *seeds = (Vector2 *)RL_MALLOC(seedsCount*sizeof(Vector2));

    for (int i = 0; i < seedsCount; i++)
    {
        int y = (i/seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        int x = (i%seedsPerRow)*tileSize + GetRandomValue(0, tileSize - 1);
        seeds[i] = (Vector2){ (float)x, (float)y};
    }

    for (int y = 0; y < height; y++)
    {
        int tileY = y/tileSize;

        for (int x = 0; x < width; x++)
        {
            int tileX = x/tileSize;

            float minDistance = (float)strtod("Inf", NULL);

            // Check all adjacent tiles
            for (int i = -1; i < 2; i++)
            {
                if ((tileX + i < 0) || (tileX + i >= seedsPerRow)) continue;

                for (int j = -1; j < 2; j++)
                {
                    if ((tileY + j < 0) || (tileY + j >= seedsPerCol)) continue;

                    Vector2 neighborSeed = seeds[(tileY + j)*seedsPerRow + tileX + i];

                    float dist = (float)hypot(x - (int)neighborSeed.x, y - (int)neighborSeed.y);
                    minDistance = (float)fmin(minDistance, dist);
                }
            }

            // I made this up but it seems to give good results at all tile sizes
            int intensity = (int)(minDistance*256.0f/tileSize);
            if (intensity > 255) intensity = 255;

            pixels[y*width + x] = (Color){ intensity, intensity, intensity, 255 };
        }
    }

    RL_FREE(seeds);

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}